

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierBuilder.cpp
# Opt level: O0

void __thiscall Refal2::CQualifierBuilder::Reset(CQualifierBuilder *this)

{
  CQualifierBuilder *this_local;
  
  this->negative = false;
  this->terms = S_None;
  CSetBuilder<char>::Reset(&this->charsBuilder);
  CSetBuilder<int>::Reset(&this->labelsBuilder);
  CSetBuilder<unsigned_int>::Reset(&this->numbersBuilder);
  std::bitset<128UL>::reset(&this->ansichars);
  std::bitset<128UL>::reset(&this->ansicharsFixed);
  return;
}

Assistant:

void CQualifierBuilder::Reset()
{
	negative = false;
	
	terms = S_None;
	
	charsBuilder.Reset();
	labelsBuilder.Reset();
	numbersBuilder.Reset();
	
	ansichars.reset();
	ansicharsFixed.reset();
}